

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyParserTransform.cpp
# Opt level: O2

bool __thiscall
Rml::PropertyParserTransform::Scan
          (PropertyParserTransform *this,int *out_bytes_read,char *str,char *keyword,
          PropertyParser **parsers,NumericValue *args,int nargs)

{
  PropertyParser *pPVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t __n;
  size_t sVar5;
  char *__s;
  bool bVar6;
  ulong uVar7;
  long lVar8;
  char *pcVar9;
  float fVar10;
  String arg_heap;
  Property prop;
  char arg_stack [1024];
  int local_538;
  allocator<char> local_531;
  ulong local_530;
  char *local_528;
  int *local_520;
  long local_518;
  NumericValue *local_510;
  PropertyParser **local_508;
  ulong local_500;
  char *local_4f8;
  undefined8 local_4f0;
  char local_4e8 [16];
  undefined1 local_4d8 [32];
  size_t local_4b8;
  undefined8 local_4b0;
  Property local_4a8;
  string local_458 [32];
  char local_438 [1032];
  
  *out_bytes_read = 0;
  local_538 = 0;
  bVar6 = false;
  local_520 = out_bytes_read;
  local_510 = args;
  local_508 = parsers;
  __isoc99_sscanf(str," %n",&local_538);
  iVar4 = local_538;
  pcVar9 = str + local_538;
  __n = strlen(keyword);
  iVar3 = bcmp(pcVar9,keyword,__n);
  if (iVar3 == 0) {
    pcVar9 = pcVar9 + (int)__n;
    local_538 = 0;
    bVar6 = false;
    __isoc99_sscanf(pcVar9," %n",&local_538);
    iVar3 = local_538;
    lVar8 = (long)local_538;
    local_538 = 0;
    __isoc99_sscanf(pcVar9 + lVar8," ( %n",&local_538);
    iVar2 = local_538;
    if ((long)local_538 != 0) {
      pcVar9 = pcVar9 + lVar8 + local_538;
      local_4f8 = local_4e8;
      local_4f0 = 0;
      local_4e8[0] = '\0';
      sVar5 = strlen(pcVar9);
      if (sVar5 < 0x400) {
        __s = local_438;
      }
      else {
        ::std::__cxx11::string::assign((char *)&local_4f8);
        __s = local_4f8;
      }
      local_530 = (ulong)(uint)(iVar2 + iVar3 + (int)__n + iVar4);
      local_518 = (long)(nargs + -1);
      uVar7 = 0;
      local_500 = (ulong)(uint)nargs;
      if (nargs < 1) {
        local_500 = uVar7;
      }
      local_528 = __s;
      do {
        if (local_500 == uVar7) {
          local_538 = 0;
          bVar6 = false;
          __isoc99_sscanf(pcVar9," ) %n",&local_538);
          if (local_538 != 0) {
            iVar4 = local_538 + (int)local_530;
            *local_520 = iVar4;
            bVar6 = iVar4 != 0 && SCARRY4(local_538,(int)local_530) == iVar4 < 0;
          }
          goto LAB_002ba9b4;
        }
        Property::Property(&local_4a8);
        local_538 = 0;
        bVar6 = false;
        __isoc99_sscanf(pcVar9," %[^,)] %n",__s,&local_538);
        if (local_538 != 0) {
          pPVar1 = local_508[uVar7];
          ::std::__cxx11::string::string<std::allocator<char>>(local_458,__s,&local_531);
          local_4d8._0_8_ = local_4d8 + 0x18;
          local_4b8 = 0;
          local_4d8._16_8_ = 0;
          local_4d8._24_8_ = 0;
          local_4b0._0_4_ = 0x20;
          local_4b0._4_4_ = 0;
          local_4d8._8_8_ = local_4d8._0_8_;
          iVar4 = (*pPVar1->_vptr_PropertyParser[2])
                            (pPVar1,&local_4a8,local_458,
                             (Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_4d8);
          robin_hood::detail::
          Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::destroy((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_4d8);
          ::std::__cxx11::string::~string(local_458);
          if ((char)iVar4 == '\0') {
            bVar6 = false;
            __s = local_528;
          }
          else {
            fVar10 = Variant::Get<float>(&local_4a8.value,0.0);
            __s = local_528;
            local_510[uVar7].number = fVar10;
            local_510[uVar7].unit = local_4a8.unit;
            pcVar9 = pcVar9 + local_538;
            local_530 = (ulong)(uint)((int)local_530 + local_538);
            bVar6 = true;
            if ((long)uVar7 < local_518) {
              local_538 = 0;
              __isoc99_sscanf(pcVar9," , %n",&local_538);
              if ((long)local_538 == 0) {
                bVar6 = false;
              }
              else {
                pcVar9 = pcVar9 + local_538;
                local_530 = (ulong)(uint)((int)local_530 + local_538);
              }
            }
          }
        }
        Property::~Property(&local_4a8);
        uVar7 = uVar7 + 1;
      } while (bVar6);
      bVar6 = false;
LAB_002ba9b4:
      ::std::__cxx11::string::~string((string *)&local_4f8);
    }
  }
  return bVar6;
}

Assistant:

bool PropertyParserTransform::Scan(int& out_bytes_read, const char* str, const char* keyword, const PropertyParser** parsers, NumericValue* args,
	int nargs) const
{
	out_bytes_read = 0;
	int total_bytes_read = 0, bytes_read = 0;

	/* skip leading white space */
	bytes_read = 0;
	sscanf(str, " %n", &bytes_read);
	str += bytes_read;
	total_bytes_read += bytes_read;

	/* find the keyword */
	if (!memcmp(str, keyword, strlen(keyword)))
	{
		bytes_read = (int)strlen(keyword);
		str += bytes_read;
		total_bytes_read += bytes_read;
	}
	else
	{
		return false;
	}

	/* skip any white space */
	bytes_read = 0;
	sscanf(str, " %n", &bytes_read);
	str += bytes_read;
	total_bytes_read += bytes_read;

	/* find the opening brace */
	bytes_read = 0;
	if (sscanf(str, " ( %n", &bytes_read), bytes_read)
	{
		str += bytes_read;
		total_bytes_read += bytes_read;
	}
	else
	{
		return false;
	}

	/* use the quicker stack-based argument buffer, if possible */
	char* arg = nullptr;
	char arg_stack[1024];
	String arg_heap;
	if (strlen(str) < sizeof(arg_stack))
	{
		arg = arg_stack;
	}
	else
	{
		arg_heap = str;
		arg = &arg_heap[0];
	}

	/* parse the arguments */
	for (int i = 0; i < nargs; ++i)
	{
		Property prop;

		bytes_read = 0;
		if (sscanf(str, " %[^,)] %n", arg, &bytes_read), bytes_read && parsers[i]->ParseValue(prop, String(arg), ParameterMap()))
		{
			args[i].number = prop.value.Get<float>();
			args[i].unit = prop.unit;
			str += bytes_read;
			total_bytes_read += bytes_read;
		}
		else
		{
			return false;
		}

		/* find the comma */
		if (i < nargs - 1)
		{
			bytes_read = 0;
			if (sscanf(str, " , %n", &bytes_read), bytes_read)
			{
				str += bytes_read;
				total_bytes_read += bytes_read;
			}
			else
			{
				return false;
			}
		}
	}

	/* find the closing brace */
	bytes_read = 0;
	if (sscanf(str, " ) %n", &bytes_read), bytes_read)
	{
		str += bytes_read;
		total_bytes_read += bytes_read;
	}
	else
	{
		return false;
	}

	out_bytes_read = total_bytes_read;
	return total_bytes_read > 0;
}